

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

int envy_bios_parse_spreadspectrum(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  envy_bios_spreadspectrum_entry *peVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  char *__format;
  int iVar15;
  
  uVar4 = (bios->spreadspectrum).offset;
  if (uVar4 == 0) {
    return 0;
  }
  if ((uint)uVar4 < bios->length) {
    (bios->spreadspectrum).version = bios->data[(uint)uVar4];
    iVar15 = 0;
  }
  else {
    (bios->spreadspectrum).version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar15 = -0xe;
  }
  lVar12 = (ulong)(bios->spreadspectrum).offset + 1;
  if ((uint)lVar12 < bios->length) {
    (bios->spreadspectrum).hlen = bios->data[lVar12];
    iVar13 = 0;
  }
  else {
    (bios->spreadspectrum).hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar13 = -0xe;
  }
  lVar12 = (ulong)(bios->spreadspectrum).offset + 2;
  if ((uint)lVar12 < bios->length) {
    (bios->spreadspectrum).entriesnum = bios->data[lVar12];
    iVar5 = 0;
  }
  else {
    (bios->spreadspectrum).entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar5 = -0xe;
  }
  lVar12 = (ulong)(bios->spreadspectrum).offset + 3;
  if ((uint)lVar12 < bios->length) {
    (bios->spreadspectrum).rlen = bios->data[lVar12];
    iVar6 = 0;
  }
  else {
    (bios->spreadspectrum).rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar6 = -0xe;
  }
  if (((iVar13 == 0 && iVar15 == 0) && iVar5 == 0) && iVar6 == 0) {
    envy_bios_block(bios,(uint)(bios->spreadspectrum).offset,
                    (uint)(bios->spreadspectrum).entriesnum * (uint)(bios->spreadspectrum).rlen +
                    (uint)(bios->spreadspectrum).hlen,"SPREADSPECTRUM",-1);
    uVar1 = (bios->spreadspectrum).version;
    if (uVar1 == '1') {
LAB_00257592:
      lVar12 = (ulong)(bios->spreadspectrum).offset + 4;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk04 = bios->data[lVar12];
        iVar15 = 0;
      }
      else {
        (bios->spreadspectrum).unk04 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar15 = -0xe;
      }
      lVar12 = (ulong)(bios->spreadspectrum).offset + 5;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk05 = bios->data[lVar12];
        iVar13 = 0;
      }
      else {
        (bios->spreadspectrum).unk05 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar13 = -0xe;
      }
      lVar12 = (ulong)(bios->spreadspectrum).offset + 6;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk06 = bios->data[lVar12];
        iVar5 = 0;
      }
      else {
        (bios->spreadspectrum).unk06 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      lVar12 = (ulong)(bios->spreadspectrum).offset + 7;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk07 = bios->data[lVar12];
        iVar6 = 0;
      }
      else {
        (bios->spreadspectrum).unk07 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar6 = -0xe;
      }
      lVar12 = (ulong)(bios->spreadspectrum).offset + 8;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk08 = bios->data[lVar12];
        iVar7 = 0;
      }
      else {
        (bios->spreadspectrum).unk08 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      lVar12 = (ulong)(bios->spreadspectrum).offset + 9;
      if ((uint)lVar12 < bios->length) {
        (bios->spreadspectrum).unk09 = bios->data[lVar12];
        iVar8 = 0;
      }
      else {
        (bios->spreadspectrum).unk09 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      if (((((iVar13 != 0 || iVar15 != 0) || iVar5 != 0) || iVar6 != 0) || iVar7 != 0) || iVar8 != 0
         ) goto LAB_00257523;
      uVar14 = 1;
      uVar11 = 10;
LAB_002576d3:
      bVar2 = (bios->spreadspectrum).hlen;
      if ((uint)bVar2 < (uint)uVar11) {
        __format = "SPREADSPECTRUM table header too short [%d < %d]\n";
      }
      else {
        bVar3 = (bios->spreadspectrum).rlen;
        if (uVar14 <= bVar3) {
          if ((uint)uVar11 < (uint)bVar2) {
            fprintf(_stderr,"SPREADSPECTRUM table header longer than expected [%d > %d]\n");
          }
          bVar2 = (bios->spreadspectrum).rlen;
          if (uVar14 < bVar2) {
            fprintf(_stderr,"SPREADSPECTRUM table record longer than expected [%d > %d]\n",
                    (ulong)bVar2,(ulong)uVar14);
          }
          peVar10 = (envy_bios_spreadspectrum_entry *)
                    calloc((ulong)(bios->spreadspectrum).entriesnum,4);
          (bios->spreadspectrum).entries = peVar10;
          if (peVar10 == (envy_bios_spreadspectrum_entry *)0x0) {
            return -0xc;
          }
          if ((bios->spreadspectrum).entriesnum != '\0') {
            uVar11 = 0;
            do {
              peVar10 = (bios->spreadspectrum).entries;
              uVar9 = (uint)(bios->spreadspectrum).rlen * (int)uVar11 +
                      (uint)(bios->spreadspectrum).hlen + (uint)(bios->spreadspectrum).offset;
              peVar10[uVar11].offset = (uint16_t)uVar9;
              uVar9 = uVar9 & 0xffff;
              if (uVar9 < bios->length) {
                peVar10[uVar11].unk00 = bios->data[uVar9];
                uVar9 = 0;
              }
              else {
                peVar10[uVar11].unk00 = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar9 = 0xfffffff2;
              }
              if (1 < (bios->spreadspectrum).rlen) {
                lVar12 = (ulong)peVar10[uVar11].offset + 1;
                if ((uint)lVar12 < bios->length) {
                  peVar10[uVar11].unk01 = bios->data[lVar12];
                  uVar14 = 0;
                }
                else {
                  peVar10[uVar11].unk01 = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar14 = 0xfffffff2;
                }
                uVar9 = uVar9 | uVar14;
              }
              if (uVar9 != 0) goto LAB_00257523;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (bios->spreadspectrum).entriesnum);
          }
          (bios->spreadspectrum).valid = '\x01';
          return 0;
        }
        __format = "SPREADSPECTRUM table record too short [%d < %d]\n";
        uVar11 = (ulong)uVar14;
        bVar2 = bVar3;
      }
      fprintf(_stderr,__format,(ulong)bVar2,uVar11);
    }
    else {
      if (uVar1 == 'A') {
        uVar14 = 2 - ((bios->spreadspectrum).rlen < 2);
        lVar12 = (ulong)(bios->spreadspectrum).offset + 4;
        uVar9 = bios->length;
        if ((uint)lVar12 < uVar9) {
          (bios->spreadspectrum).unk04 = bios->data[lVar12];
        }
        else {
          (bios->spreadspectrum).unk04 = '\0';
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar12);
        }
        uVar11 = 5;
        if (uVar9 <= (uint)lVar12) goto LAB_00257523;
        goto LAB_002576d3;
      }
      if (uVar1 == '@') goto LAB_00257592;
      envy_bios_parse_spreadspectrum_cold_1();
    }
    iVar15 = -0x16;
  }
  else {
LAB_00257523:
    iVar15 = -0xe;
  }
  return iVar15;
}

Assistant:

int envy_bios_parse_spreadspectrum (struct envy_bios *bios) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, spreadspectrum->offset, &spreadspectrum->version);
	err |= bios_u8(bios, spreadspectrum->offset+1, &spreadspectrum->hlen);
	err |= bios_u8(bios, spreadspectrum->offset+2, &spreadspectrum->entriesnum);
	err |= bios_u8(bios, spreadspectrum->offset+3, &spreadspectrum->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, spreadspectrum->offset, spreadspectrum->hlen + spreadspectrum->rlen * spreadspectrum->entriesnum, "SPREADSPECTRUM", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (spreadspectrum->version) {
		case 0x31:
		case 0x40:
			wanthlen = 10;
			wantrlen = 1;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			err |= bios_u8(bios, spreadspectrum->offset+5, &spreadspectrum->unk05);
			err |= bios_u8(bios, spreadspectrum->offset+6, &spreadspectrum->unk06);
			err |= bios_u8(bios, spreadspectrum->offset+7, &spreadspectrum->unk07);
			err |= bios_u8(bios, spreadspectrum->offset+8, &spreadspectrum->unk08);
			err |= bios_u8(bios, spreadspectrum->offset+9, &spreadspectrum->unk09);
			if (err)
				return -EFAULT;
			break;
		case 0x41:
			wanthlen = 5;
			wantrlen = 1;
			if (spreadspectrum->rlen >= 2)
				wantrlen = 2;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			if (err)
				return -EFAULT;
			break;
		default:
			ENVY_BIOS_ERR("Unknown SPREADSPECTRUM table version %d.%d\n", spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
			return -EINVAL;
	}
	if (spreadspectrum->hlen < wanthlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table header too short [%d < %d]\n", spreadspectrum->hlen, wanthlen);
		return -EINVAL;
	}
	if (spreadspectrum->rlen < wantrlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table record too short [%d < %d]\n", spreadspectrum->rlen, wantrlen);
		return -EINVAL;
	}
	if (spreadspectrum->hlen > wanthlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table header longer than expected [%d > %d]\n", spreadspectrum->hlen, wanthlen);
	}
	if (spreadspectrum->rlen > wantrlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table record longer than expected [%d > %d]\n", spreadspectrum->rlen, wantrlen);
	}
	spreadspectrum->entries = calloc(spreadspectrum->entriesnum, sizeof *spreadspectrum->entries);
	if (!spreadspectrum->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		entry->offset = spreadspectrum->offset + spreadspectrum->hlen + spreadspectrum->rlen * i;
		err |= bios_u8(bios, entry->offset+0, &entry->unk00);
		if (spreadspectrum->rlen >= 2)
			err |= bios_u8(bios, entry->offset+1, &entry->unk01);
		if (err)
			return -EFAULT;
	}
	spreadspectrum->valid = 1;
	return 0;
}